

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_qpak.c
# Opt level: O0

int qpakLoadEntries(PHYSFS_Io *io,PHYSFS_uint32 count,void *arc)

{
  int iVar1;
  void *pvVar2;
  char local_78 [8];
  char name [56];
  PHYSFS_uint32 local_34;
  PHYSFS_uint32 local_30;
  PHYSFS_uint32 pos;
  PHYSFS_uint32 size;
  PHYSFS_uint32 i;
  void *arc_local;
  PHYSFS_Io *pPStack_18;
  PHYSFS_uint32 count_local;
  PHYSFS_Io *io_local;
  
  pos = 0;
  _size = arc;
  arc_local._4_4_ = count;
  pPStack_18 = io;
  while( true ) {
    if (arc_local._4_4_ <= pos) {
      return 1;
    }
    iVar1 = __PHYSFS_readAll(pPStack_18,local_78,0x38);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = __PHYSFS_readAll(pPStack_18,&local_34,4);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = __PHYSFS_readAll(pPStack_18,&local_30,4);
    if (iVar1 == 0) break;
    local_30 = PHYSFS_swapULE32(local_30);
    local_34 = PHYSFS_swapULE32(local_34);
    pvVar2 = UNPK_addEntry(_size,local_78,0,-1,-1,(ulong)local_34,(ulong)local_30);
    if (pvVar2 == (void *)0x0) {
      return 0;
    }
    pos = pos + 1;
  }
  return 0;
}

Assistant:

static int qpakLoadEntries(PHYSFS_Io *io, const PHYSFS_uint32 count, void *arc)
{
    PHYSFS_uint32 i;
    for (i = 0; i < count; i++)
    {
        PHYSFS_uint32 size;
        PHYSFS_uint32 pos;
        char name[56];
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, name, 56), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &pos, 4), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &size, 4), 0);
        size = PHYSFS_swapULE32(size);
        pos = PHYSFS_swapULE32(pos);
        BAIL_IF_ERRPASS(!UNPK_addEntry(arc, name, 0, -1, -1, pos, size), 0);
    } /* for */

    return 1;
}